

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-option-parser.cc
# Opt level: O2

void __thiscall OptionParser_LongFlag_Test::TestBody(OptionParser_LongFlag_Test *this)

{
  char *message;
  bool flag;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  AssertionResult gtest_ar;
  AssertHelper local_d0;
  char *args [2];
  OptionParser parser;
  
  flag = false;
  wabt::OptionParser::OptionParser(&parser,"prog","desc");
  args[1] = (char *)0x0;
  args[0] = &flag;
  wabt::OptionParser::AddOption(&parser,"flag","help",(NullCallback *)args);
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-option-parser.cc:28:36)>
  ::_M_manager((_Any_data *)args,(_Any_data *)args,__destroy_functor);
  args[0] = "prog name";
  args[1] = "--flag";
  wabt::OptionParser::Parse(&parser,2,args);
  local_e8.ptr_._0_1_ = 1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&gtest_ar,"true","flag",(bool *)&local_e8,&flag);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_e8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-option-parser.cc"
               ,0x1f,message);
    testing::internal::AssertHelper::operator=(&local_d0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  wabt::OptionParser::~OptionParser(&parser);
  return;
}

Assistant:

TEST(OptionParser, LongFlag) {
  bool flag = false;
  OptionParser parser("prog", "desc");
  parser.AddOption("flag", "help", [&]() { flag = true; });
  const char* args[] = {"prog name", "--flag"};
  parser.Parse(2, const_cast<char**>(args));
  EXPECT_EQ(true, flag);
}